

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solvers.cpp
# Opt level: O0

vector<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
* getPredefinedTransformations1M1Q<double>
            (vector<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
             *__return_storage_ptr__,Matrix<double,_6,_1,_0,_6,_1> *l1,
            Matrix<double,_6,_1,_0,_6,_1> *l2)

{
  EigenBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false>_> *pEVar1;
  DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *pDVar2;
  DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *this;
  Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false> *this_00;
  Block<Eigen::Matrix<double,4,4,0,4,4>,_1,_1,false> *this_01;
  CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *pCVar3;
  RealScalar RVar4;
  RealScalar RVar5;
  Product<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0> local_12a8;
  undefined1 local_1298 [8];
  Matrix<double,_4,_4,_0,_4,_4> TU_B;
  Matrix<double,4,4,0,4,4> local_1208 [8];
  Matrix<double,_4,_4,_0,_4,_4> TU;
  Block<Eigen::Matrix<double,6,6,0,6,6>,_1,_1,false> local_1180 [56];
  Block<Eigen::Matrix<double,6,6,0,6,6>,_1,_1,false> local_1148 [61];
  EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_6,_6,_0,_6,_6>_>_>
  local_110b [3];
  Matrix<double,6,6,0,6,6> local_1108 [8];
  Matrix<double,_6,_6,_0,_6,_6> TUL2;
  EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
  local_fab [3];
  Matrix<double,4,4,0,4,4> local_fa8 [8];
  Matrix<double,_4,_4,_0,_4,_4> TU2;
  non_const_type local_ef8;
  Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false> local_ef0 [48];
  DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> local_ec0 [24];
  non_const_type local_ea8;
  Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false> local_ea0 [48];
  non_const_type local_e70;
  DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> local_e68 [8];
  Matrix<double,_3,_3,_0,_3,_3> U2;
  PlainObject local_e08;
  undefined1 local_df0 [8];
  Matrix<double,_3,_1,_0,_3,_1> U2_3P;
  Matrix<double,_3,_1,_0,_3,_1> U2_3M;
  Type local_d88;
  EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_6,_6,_0,_6,_6>_>_>
  local_d4b [3];
  Matrix<double,6,6,0,6,6> local_d48 [8];
  Matrix<double,_6,_6,_0,_6,_6> TUL1;
  EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
  local_beb [3];
  Matrix<double,4,4,0,4,4> local_be8 [8];
  Matrix<double,_4,_4,_0,_4,_4> TU1;
  RowXpr local_b60;
  non_const_type local_b30;
  RowXpr local_b28;
  type local_af8;
  non_const_type local_ae0;
  RowXpr local_ad8;
  non_const_type local_aa8;
  undefined1 local_aa0 [8];
  Matrix<double,_3,_3,_0,_3,_3> U1;
  PlainObject local_a40;
  undefined1 local_a28 [8];
  Matrix<double,_3,_1,_0,_3,_1> U1_3P;
  Matrix<double,_3,_1,_0,_3,_1> U1_3M;
  Matrix<double,_3,_1,_0,_3,_1> U2_1;
  Matrix<double,_3,_1,_0,_3,_1> U1_1;
  Scalar local_9c0;
  Scalar local_9b8;
  CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> local_9b0;
  Scalar local_990 [3];
  Scalar local_978;
  Scalar local_970;
  CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> local_968;
  undefined1 local_948 [8];
  Matrix<double,_3,_1,_0,_3,_1> ey;
  Matrix<double,_3,_1,_0,_3,_1> ex;
  Matrix<double,3,1,0,3,1> local_8e0 [8];
  Matrix<double,_3,_1,_0,_3,_1> U2_3;
  Matrix<double,3,1,0,3,1> local_890 [8];
  Matrix<double,_3,_1,_0,_3,_1> U1_3;
  Matrix<double,6,1,0,6,1> local_868 [8];
  Matrix<double,_6,_1,_0,_6,_1> lu2;
  Matrix<double,6,1,0,6,1> local_828 [8];
  Matrix<double,_6,_1,_0,_6,_1> lu1;
  Block<Eigen::Matrix<double,6,6,0,6,6>,_1,_1,false> local_7f0 [56];
  Matrix<double,_3,_1,_0,_3,_1> local_7b8;
  DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> local_7a0 [72];
  DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  local_758 [16];
  Block<Eigen::Matrix<double,6,6,0,6,6>,_1,_1,false> local_748 [56];
  Matrix<double,_3,_1,_0,_3,_1> local_710;
  DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> local_6f8 [72];
  DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  local_6b0 [21];
  EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_6,_6,_0,_6,_6>_>_>
  local_69b [3];
  Matrix<double,6,6,0,6,6> local_698 [8];
  Matrix<double,_6,_6,_0,_6,_6> TuL2;
  EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_6,_6,_0,_6,_6>_>_>
  local_56b [3];
  Matrix<double,6,6,0,6,6> local_568 [8];
  Matrix<double,_6,_6,_0,_6,_6> TuL1;
  Block<Eigen::Matrix<double,4,4,0,4,4>,_1,_1,false> local_440 [56];
  Block<Eigen::Matrix<double,4,4,0,4,4>,_1,_1,false> local_408 [61];
  EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
  local_3cb [3];
  Matrix<double,4,4,0,4,4> local_3c8 [8];
  Matrix<double,_4,_4,_0,_4,_4> Tu2;
  EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
  local_33b [3];
  Matrix<double,4,4,0,4,4> local_338 [8];
  Matrix<double,_4,_4,_0,_4,_4> Tu1;
  non_const_type local_2b0;
  Product<Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>
  local_2a8;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
  local_298;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  local_270;
  Matrix<double,3,1,0,3,1> local_238 [8];
  Matrix<double,_3,_1,_0,_3,_1> u2;
  Product<Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>
  local_218;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
  local_208;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  local_1e0;
  Matrix<double,3,1,0,3,1> local_1a8 [8];
  Matrix<double,_3,_1,_0,_3,_1> u1;
  Matrix<double,_3,_1,_0,_3,_1> x2;
  Matrix<double,_3,_1,_0,_3,_1> x1;
  Matrix<double,3,1,0,3,1> local_128 [8];
  Matrix<double,_3,_1,_0,_3,_1> m2;
  Matrix<double,3,1,0,3,1> local_d8 [8];
  Matrix<double,_3,_1,_0,_3,_1> dir2;
  Matrix<double,3,1,0,3,1> local_88 [8];
  Matrix<double,_3,_1,_0,_3,_1> m1;
  Matrix<double,3,1,0,3,1> local_38 [8];
  Matrix<double,_3,_1,_0,_3,_1> dir1;
  Matrix<double,_6,_1,_0,_6,_1> *l2_local;
  Matrix<double,_6,_1,_0,_6,_1> *l1_local;
  vector<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
  *trans;
  
  pEVar1 = (EigenBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false>_> *)
           (m1.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array +
           2);
  dir1.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
       (double)l2;
  Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::head<int>
            ((Type *)pEVar1,(DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)l1,3);
  Eigen::Matrix<double,3,1,0,3,1>::Matrix<Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,_1,1,false>>
            (local_38,pEVar1);
  pEVar1 = (EigenBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false>_> *)
           (dir2.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
           + 2);
  Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::tail<int>
            ((Type *)pEVar1,(DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)l1,3);
  Eigen::Matrix<double,3,1,0,3,1>::Matrix<Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,_1,1,false>>
            (local_88,pEVar1);
  pEVar1 = (EigenBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false>_> *)
           (m2.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array +
           2);
  Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::head<int>
            ((Type *)pEVar1,(DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)l2,3);
  Eigen::Matrix<double,3,1,0,3,1>::Matrix<Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,_1,1,false>>
            (local_d8,pEVar1);
  pEVar1 = (EigenBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false>_> *)
           (x1.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array +
           2);
  Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::tail<int>
            ((Type *)pEVar1,(DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)l2,3);
  Eigen::Matrix<double,3,1,0,3,1>::Matrix<Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,_1,1,false>>
            (local_128,pEVar1);
  pDVar2 = (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
           (x2.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array +
           2);
  Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::cross<Eigen::Matrix<double,3,1,0,3,1>>
            ((type *)pDVar2,(MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *)local_38,
             (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)local_88);
  this = (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
         (u1.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array + 2
         );
  Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::cross<Eigen::Matrix<double,3,1,0,3,1>>
            ((type *)this,(MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *)local_d8,
             (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)local_128);
  u2.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
       (double)Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::transpose(pDVar2);
  local_218 = Eigen::MatrixBase<Eigen::Transpose<Eigen::Matrix<double,3,1,0,3,1>>>::operator*
                        ((MatrixBase<Eigen::Transpose<Eigen::Matrix<double,3,1,0,3,1>>> *)
                         (u2.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                          m_data.array + 2),
                         (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)local_38);
  Eigen::operator*(&local_208,&local_218,(StorageBaseType *)local_38);
  Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator-
            (&local_1e0,(MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *)pDVar2,
             (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              *)&local_208);
  Eigen::Matrix<double,3,1,0,3,1>::
  Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>const>>
            (local_1a8,
             (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
              *)&local_1e0);
  local_2b0 = (non_const_type)
              Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::transpose(this);
  local_2a8 = Eigen::MatrixBase<Eigen::Transpose<Eigen::Matrix<double,3,1,0,3,1>>>::operator*
                        ((MatrixBase<Eigen::Transpose<Eigen::Matrix<double,3,1,0,3,1>>> *)&local_2b0
                         ,(MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)local_d8);
  Eigen::operator*(&local_298,&local_2a8,(StorageBaseType *)local_d8);
  Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator-
            (&local_270,(MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *)this,
             (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              *)&local_298);
  Eigen::Matrix<double,3,1,0,3,1>::
  Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>const>>
            (local_238,
             (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
              *)&local_270);
  Eigen::MatrixBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::Identity();
  Eigen::Matrix<double,4,4,0,4,4>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,4,4,0,4,4>>>
            (local_338,local_33b);
  Eigen::MatrixBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::Identity();
  Eigen::Matrix<double,4,4,0,4,4>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,4,4,0,4,4>>>
            (local_3c8,local_3cb);
  Eigen::DenseBase<Eigen::Matrix<double,4,4,0,4,4>>::topRightCorner<int,int>
            ((Type *)local_408,(DenseBase<Eigen::Matrix<double,4,4,0,4,4>> *)local_338,3,1);
  Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,-1,-1,false>::operator=
            (local_408,(DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)local_1a8);
  Eigen::DenseBase<Eigen::Matrix<double,4,4,0,4,4>>::topRightCorner<int,int>
            ((Type *)local_440,(DenseBase<Eigen::Matrix<double,4,4,0,4,4>> *)local_3c8,3,1);
  Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,-1,-1,false>::operator=
            (local_440,(DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)local_238);
  Eigen::MatrixBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>::Identity();
  Eigen::Matrix<double,6,6,0,6,6>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,6,6,0,6,6>>>
            (local_568,local_56b);
  Eigen::MatrixBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>::Identity();
  Eigen::Matrix<double,6,6,0,6,6>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,6,6,0,6,6>>>
            (local_698,local_69b);
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix
            (&local_710,(Matrix<double,_3,_1,_0,_3,_1> *)local_1a8);
  getSkew<double>((Matrix<double,_3,_3,_0,_3,_3> *)local_6f8,&local_710);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator-
            ((NegativeReturnType *)local_6b0,local_6f8);
  Eigen::DenseBase<Eigen::Matrix<double,6,6,0,6,6>>::block<int,int>
            ((Type *)local_748,(DenseBase<Eigen::Matrix<double,6,6,0,6,6>> *)local_568,3,0,3,3);
  Eigen::Block<Eigen::Matrix<double,6,6,0,6,6>,-1,-1,false>::operator=(local_748,local_6b0);
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix
            (&local_7b8,(Matrix<double,_3,_1,_0,_3,_1> *)local_238);
  getSkew<double>((Matrix<double,_3,_3,_0,_3,_3> *)local_7a0,&local_7b8);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator-
            ((NegativeReturnType *)local_758,local_7a0);
  Eigen::DenseBase<Eigen::Matrix<double,6,6,0,6,6>>::block<int,int>
            ((Type *)local_7f0,(DenseBase<Eigen::Matrix<double,6,6,0,6,6>> *)local_698,3,0,3,3);
  Eigen::Block<Eigen::Matrix<double,6,6,0,6,6>,-1,-1,false>::operator=(local_7f0,local_758);
  join_0x00000010_0x00000000_ =
       Eigen::MatrixBase<Eigen::Matrix<double,6,6,0,6,6>>::operator*
                 ((MatrixBase<Eigen::Matrix<double,6,6,0,6,6>> *)local_568,
                  (MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)l1);
  Eigen::Matrix<double,6,1,0,6,1>::
  Matrix<Eigen::Product<Eigen::Matrix<double,6,6,0,6,6>,Eigen::Matrix<double,6,1,0,6,1>,0>>
            (local_828,
             (EigenBase<Eigen::Product<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>_>
              *)(lu2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                 array + 5));
  join_0x00000010_0x00000000_ =
       Eigen::MatrixBase<Eigen::Matrix<double,6,6,0,6,6>>::operator*
                 ((MatrixBase<Eigen::Matrix<double,6,6,0,6,6>> *)local_698,
                  (MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)l2);
  Eigen::Matrix<double,6,1,0,6,1>::
  Matrix<Eigen::Product<Eigen::Matrix<double,6,6,0,6,6>,Eigen::Matrix<double,6,1,0,6,1>,0>>
            (local_868,
             (EigenBase<Eigen::Product<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>_>
              *)(U1_3.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                 array + 2));
  pEVar1 = (EigenBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false>_> *)
           (U2_3.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
           + 2);
  Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::head<int>
            ((Type *)pEVar1,(DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)local_828,3);
  Eigen::Matrix<double,3,1,0,3,1>::Matrix<Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,_1,1,false>>
            (local_890,pEVar1);
  pEVar1 = (EigenBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false>_> *)
           (ex.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array +
           2);
  Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::head<int>
            ((Type *)pEVar1,(DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)local_868,3);
  Eigen::Matrix<double,3,1,0,3,1>::Matrix<Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,_1,1,false>>
            (local_8e0,pEVar1);
  pDVar2 = (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
           (ey.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array +
           2);
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix((Matrix<double,_3,_1,_0,_3,_1> *)pDVar2);
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix((Matrix<double,_3,_1,_0,_3,_1> *)local_948);
  local_970 = 1.0;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator<<(&local_968,pDVar2,&local_970);
  local_978 = 0.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator_
                     (&local_968,&local_978);
  local_990[0] = 0.0;
  Eigen::CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator_(pCVar3,local_990);
  Eigen::CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::~CommaInitializer(&local_968);
  local_9b8 = 0.0;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator<<
            (&local_9b0,(DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)local_948,&local_9b8);
  local_9c0 = 1.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator_
                     (&local_9b0,&local_9c0);
  U1_1.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] = 0.0;
  Eigen::CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator_
            (pCVar3,U1_1.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                    m_data.array + 2);
  Eigen::CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::~CommaInitializer(&local_9b0);
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix
            ((Matrix<double,_3,_1,_0,_3,_1> *)
             (U2_1.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
              array + 2));
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix
            ((Matrix<double,_3,_1,_0,_3,_1> *)
             (U1_3M.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
              array + 2));
  Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::cross<Eigen::Matrix<double,3,1,0,3,1>>
            ((type *)(U1_3P.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                      m_data.array + 2),(MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *)local_948,
             (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)local_890);
  Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::cross<Eigen::Matrix<double,3,1,0,3,1>>
            ((type *)local_a28,
             (MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *)
             (ey.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
             + 2),(MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)local_890);
  RVar4 = Eigen::MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::norm
                    ((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                     (U1_3P.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                      m_data.array + 2));
  RVar5 = Eigen::MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::norm
                    ((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)local_a28);
  if (RVar4 <= RVar5) {
    Eigen::MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::normalized
              ((PlainObject *)
               (U1.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                array + 8),(MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)local_a28);
    Eigen::Matrix<double,_3,_1,_0,_3,_1>::operator=
              ((Matrix<double,_3,_1,_0,_3,_1> *)
               (U2_1.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                array + 2),
               (Matrix<double,_3,_1,_0,_3,_1> *)
               (U1.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                array + 8));
  }
  else {
    Eigen::MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::normalized
              (&local_a40,
               (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
               (U1_3P.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                array + 2));
    Eigen::Matrix<double,_3,_1,_0,_3,_1>::operator=
              ((Matrix<double,_3,_1,_0,_3,_1> *)
               (U2_1.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                array + 2),&local_a40);
  }
  Eigen::Matrix<double,_3,_3,_0,_3,_3>::Matrix((Matrix<double,_3,_3,_0,_3,_3> *)local_aa0);
  local_aa8 = (non_const_type)
              Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::transpose
                        ((DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                         (U2_1.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                          m_storage.m_data.array + 2));
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row
            (&local_ad8,(DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)local_aa0,0);
  Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>::operator=
            ((Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false> *)&local_ad8,
             (DenseBase<Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_> *)&local_aa8);
  Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::cross<Eigen::Matrix<double,3,1,0,3,1>>
            (&local_af8,(MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *)local_890,
             (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
             (U2_1.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
              array + 2));
  local_ae0 = (non_const_type)
              Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::transpose
                        ((DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&local_af8);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row
            (&local_b28,(DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)local_aa0,1);
  Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>::operator=
            ((Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false> *)&local_b28,
             (DenseBase<Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_> *)&local_ae0);
  local_b30 = (non_const_type)
              Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::transpose
                        ((DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)local_890);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row
            (&local_b60,(DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)local_aa0,2);
  Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>::operator=
            ((Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false> *)&local_b60,
             (DenseBase<Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_> *)&local_b30);
  Eigen::MatrixBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::Identity();
  Eigen::Matrix<double,4,4,0,4,4>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,4,4,0,4,4>>>
            (local_be8,local_beb);
  Eigen::DenseBase<Eigen::Matrix<double,4,4,0,4,4>>::topLeftCorner<int,int>
            ((Type *)(TUL1.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                      m_data.array + 0x23),(DenseBase<Eigen::Matrix<double,4,4,0,4,4>> *)local_be8,3
             ,3);
  Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,-1,-1,false>::operator=
            ((Block<Eigen::Matrix<double,4,4,0,4,4>,_1,_1,false> *)
             (TUL1.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
              array + 0x23),(DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)local_aa0);
  Eigen::MatrixBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>::Identity();
  Eigen::Matrix<double,6,6,0,6,6>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,6,6,0,6,6>>>
            (local_d48,local_d4b);
  Eigen::DenseBase<Eigen::Matrix<double,6,6,0,6,6>>::topLeftCorner<int,int>
            (&local_d88,(DenseBase<Eigen::Matrix<double,6,6,0,6,6>> *)local_d48,3,3);
  Eigen::Block<Eigen::Matrix<double,6,6,0,6,6>,-1,-1,false>::operator=
            ((Block<Eigen::Matrix<double,6,6,0,6,6>,_1,_1,false> *)&local_d88,
             (DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)local_aa0);
  Eigen::DenseBase<Eigen::Matrix<double,6,6,0,6,6>>::block<int,int>
            ((Type *)(U2_3M.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                      m_data.array + 2),(DenseBase<Eigen::Matrix<double,6,6,0,6,6>> *)local_d48,3,3,
             3,3);
  Eigen::Block<Eigen::Matrix<double,6,6,0,6,6>,-1,-1,false>::operator=
            ((Block<Eigen::Matrix<double,6,6,0,6,6>,_1,_1,false> *)
             (U2_3M.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
              array + 2),(DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)local_aa0);
  Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::cross<Eigen::Matrix<double,3,1,0,3,1>>
            ((type *)(U2_3P.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                      m_data.array + 2),(MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *)local_948,
             (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)local_8e0);
  Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::cross<Eigen::Matrix<double,3,1,0,3,1>>
            ((type *)local_df0,
             (MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *)
             (ey.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
             + 2),(MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)local_8e0);
  RVar4 = Eigen::MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::norm
                    ((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                     (U2_3P.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                      m_data.array + 2));
  RVar5 = Eigen::MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::norm
                    ((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)local_df0);
  if (RVar4 <= RVar5) {
    Eigen::MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::normalized
              ((PlainObject *)
               (U2.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                array + 8),(MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)local_df0);
    Eigen::Matrix<double,_3,_1,_0,_3,_1>::operator=
              ((Matrix<double,_3,_1,_0,_3,_1> *)
               (U1_3M.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                array + 2),
               (Matrix<double,_3,_1,_0,_3,_1> *)
               (U2.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                array + 8));
  }
  else {
    Eigen::MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::normalized
              (&local_e08,
               (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
               (U2_3P.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                array + 2));
    Eigen::Matrix<double,_3,_1,_0,_3,_1>::operator=
              ((Matrix<double,_3,_1,_0,_3,_1> *)
               (U1_3M.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                array + 2),&local_e08);
  }
  Eigen::Matrix<double,_3,_3,_0,_3,_3>::Matrix((Matrix<double,_3,_3,_0,_3,_3> *)local_e68);
  pDVar2 = (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
           (U1_3M.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
            array + 2);
  local_e70 = (non_const_type)
              Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::transpose(pDVar2);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row((RowXpr *)local_ea0,local_e68,0);
  Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>::operator=
            (local_ea0,
             (DenseBase<Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_> *)&local_e70);
  Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::cross<Eigen::Matrix<double,3,1,0,3,1>>
            ((type *)local_ec0,(MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *)local_8e0,
             (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)pDVar2);
  local_ea8 = (non_const_type)
              Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::transpose(local_ec0);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row((RowXpr *)local_ef0,local_e68,1);
  Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>::operator=
            (local_ef0,
             (DenseBase<Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_> *)&local_ea8);
  local_ef8 = (non_const_type)
              Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::transpose
                        ((DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)local_8e0);
  this_00 = (Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false> *)
            (TU2.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
            + 0xf);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row((RowXpr *)this_00,local_e68,2);
  Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>::operator=
            (this_00,(DenseBase<Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_> *)
                     &local_ef8);
  Eigen::MatrixBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::Identity();
  Eigen::Matrix<double,4,4,0,4,4>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,4,4,0,4,4>>>
            (local_fa8,local_fab);
  this_01 = (Block<Eigen::Matrix<double,4,4,0,4,4>,_1,_1,false> *)
            (TUL2.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
             array + 0x23);
  Eigen::DenseBase<Eigen::Matrix<double,4,4,0,4,4>>::topLeftCorner<int,int>
            ((Type *)this_01,(DenseBase<Eigen::Matrix<double,4,4,0,4,4>> *)local_fa8,3,3);
  Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,-1,-1,false>::operator=(this_01,local_e68);
  Eigen::MatrixBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>::Identity();
  Eigen::Matrix<double,6,6,0,6,6>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,6,6,0,6,6>>>
            (local_1108,local_110b);
  Eigen::DenseBase<Eigen::Matrix<double,6,6,0,6,6>>::topLeftCorner<int,int>
            ((Type *)local_1148,(DenseBase<Eigen::Matrix<double,6,6,0,6,6>> *)local_1108,3,3);
  Eigen::Block<Eigen::Matrix<double,6,6,0,6,6>,-1,-1,false>::operator=(local_1148,local_e68);
  Eigen::DenseBase<Eigen::Matrix<double,6,6,0,6,6>>::block<int,int>
            ((Type *)local_1180,(DenseBase<Eigen::Matrix<double,6,6,0,6,6>> *)local_1108,3,3,3,3);
  Eigen::Block<Eigen::Matrix<double,6,6,0,6,6>,-1,-1,false>::operator=(local_1180,local_e68);
  join_0x00000010_0x00000000_ =
       Eigen::MatrixBase<Eigen::Matrix<double,4,4,0,4,4>>::operator*
                 ((MatrixBase<Eigen::Matrix<double,4,4,0,4,4>> *)local_be8,
                  (MatrixBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *)local_338);
  Eigen::Matrix<double,4,4,0,4,4>::
  Matrix<Eigen::Product<Eigen::Matrix<double,4,4,0,4,4>,Eigen::Matrix<double,4,4,0,4,4>,0>>
            (local_1208,
             (EigenBase<Eigen::Product<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>_>
              *)(TU_B.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
                 array + 0xf));
  local_12a8 = Eigen::MatrixBase<Eigen::Matrix<double,4,4,0,4,4>>::operator*
                         ((MatrixBase<Eigen::Matrix<double,4,4,0,4,4>> *)local_fa8,
                          (MatrixBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *)local_3c8);
  Eigen::Matrix<double,4,4,0,4,4>::
  Matrix<Eigen::Product<Eigen::Matrix<double,4,4,0,4,4>,Eigen::Matrix<double,4,4,0,4,4>,0>>
            ((Matrix<double,4,4,0,4,4> *)local_1298,
             (EigenBase<Eigen::Product<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>_>
              *)&local_12a8);
  std::
  vector<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
  ::vector(__return_storage_ptr__);
  std::
  vector<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
  ::push_back(__return_storage_ptr__,(value_type *)local_1208);
  std::
  vector<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
  ::push_back(__return_storage_ptr__,(value_type *)local_1298);
  return __return_storage_ptr__;
}

Assistant:

vector<Matrix<floatPrec, 4,4>> getPredefinedTransformations1M1Q(Matrix<floatPrec, 6,1> l1, Matrix<floatPrec, 6,1> l2){

	// get closest point --in the line-- to the origin
	Eigen::Matrix<floatPrec,3,1> dir1 = l1.head(3), m1 = l1.tail(3);
	Eigen::Matrix<floatPrec,3,1> dir2 = l2.head(3), m2 = l2.tail(3);
	Eigen::Matrix<floatPrec,3,1> x1 = dir1.cross(m1);
	Eigen::Matrix<floatPrec,3,1> x2 = dir2.cross(m2);
	
	// get transform to translate frames to the line
	Eigen::Matrix<floatPrec,3,1> u1 = x1 - x1.transpose()*dir1*dir1;
	Eigen::Matrix<floatPrec,3,1> u2 = x2 - x2.transpose()*dir2*dir2;
	Eigen::Matrix<floatPrec,4,4> Tu1 = Eigen::Matrix<floatPrec,4,4>::Identity(), Tu2 = Eigen::Matrix<floatPrec,4,4>::Identity();
	Tu1.topRightCorner(3,1) = u1;
	Tu2.topRightCorner(3,1) = u2;
	Eigen::Matrix<floatPrec,6,6> TuL1 = Eigen::Matrix<floatPrec,6,6>::Identity(), TuL2 = Eigen::Matrix<floatPrec,6,6>::Identity();
	TuL1.block(3,0,3,3) = -getSkew<floatPrec>(u1);
	TuL2.block(3,0,3,3) = -getSkew<floatPrec>(u2);

	// transform point and line to new ref
	Eigen::Matrix<floatPrec,6,1> lu1 = TuL1*l1;
	Eigen::Matrix<floatPrec,6,1> lu2 = TuL2*l2;

	//align z axis with line direction
	Eigen::Matrix<floatPrec,3,1> U1_3 = lu1.head(3), U2_3 = lu2.head(3);
	Eigen::Matrix<floatPrec,3,1> ex, ey;
	ex << 1,0,0; ey << 0,1,0;
	Eigen::Matrix<floatPrec,3,1> U1_1, U2_1;
	// frame A
	Eigen::Matrix<floatPrec,3,1> U1_3M = ey.cross(U1_3);
	Eigen::Matrix<floatPrec,3,1> U1_3P = ex.cross(U1_3);
	if(U1_3M.norm() > U1_3P.norm())
		U1_1 = U1_3M.normalized();
	else
		U1_1 = U1_3P.normalized();
	Eigen::Matrix<floatPrec,3,3> U1;
	U1.row(0) = U1_1.transpose();
	U1.row(1) = U1_3.cross(U1_1).transpose();
	U1.row(2) = U1_3.transpose();
	Eigen::Matrix<floatPrec,4,4> TU1 = Eigen::Matrix<floatPrec,4,4>::Identity();
	TU1.topLeftCorner(3,3) = U1;
	Eigen::Matrix<floatPrec,6,6> TUL1 = Eigen::Matrix<floatPrec,6,6>::Identity();
	TUL1.topLeftCorner(3,3) = U1; TUL1.block(3,3,3,3) = U1;
	// frame B
	Eigen::Matrix<floatPrec,3,1> U2_3M = ey.cross(U2_3);
	Eigen::Matrix<floatPrec,3,1> U2_3P = ex.cross(U2_3);
	if(U2_3M.norm() > U2_3P.norm())
		U2_1 = U2_3M.normalized();
	else
		U2_1 = U2_3P.normalized();
	Eigen::Matrix<floatPrec,3,3> U2;
	U2.row(0) = U2_1.transpose();
	U2.row(1) = U2_3.cross(U2_1).transpose();
	U2.row(2) = U2_3.transpose();
	Eigen::Matrix<floatPrec,4,4> TU2 = Eigen::Matrix<floatPrec,4,4>::Identity();
	TU2.topLeftCorner(3,3) = U2;
	Eigen::Matrix<floatPrec,6,6> TUL2 = Eigen::Matrix<floatPrec,6,6>::Identity();
	TUL2.topLeftCorner(3,3) = U2; TUL2.block(3,3,3,3) = U2;

	Eigen::Matrix<floatPrec,4,4> TU = TU1*Tu1;
	Eigen::Matrix<floatPrec,4,4> TU_B = TU2*Tu2;

	std::vector<Eigen::Matrix<floatPrec,4,4>> trans;
	trans.push_back(TU);
	trans.push_back(TU_B);

	return trans;

}